

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Vector<char32_t>::~Vector(Vector<char32_t> *this)

{
  char32_t *pcVar1;
  RemoveConst<char32_t> *pRVar2;
  char32_t *pcVar3;
  ArrayDisposer *pAVar4;
  
  pcVar1 = (this->builder).ptr;
  if (pcVar1 != (char32_t *)0x0) {
    pRVar2 = (this->builder).pos;
    pcVar3 = (this->builder).endPtr;
    (this->builder).ptr = (char32_t *)0x0;
    (this->builder).pos = (RemoveConst<char32_t> *)0x0;
    (this->builder).endPtr = (char32_t *)0x0;
    pAVar4 = (this->builder).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pcVar1,4,(long)pRVar2 - (long)pcVar1 >> 2,(long)pcVar3 - (long)pcVar1 >> 2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }